

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.c
# Opt level: O0

void ZSTD_ldm_gear_init(ldmRollingHashState_t *state,ldmParams_t *params)

{
  uint uVar1;
  byte bVar2;
  uint local_24;
  uint hashRateLog;
  uint maxBitsInMask;
  ldmParams_t *params_local;
  ldmRollingHashState_t *state_local;
  
  if (params->minMatchLength < 0x40) {
    local_24 = params->minMatchLength;
  }
  else {
    local_24 = 0x40;
  }
  uVar1 = params->hashRateLog;
  state->rolling = 0xffffffff;
  bVar2 = (byte)uVar1;
  if ((uVar1 == 0) || (local_24 < uVar1)) {
    state->stopMask = (1L << (bVar2 & 0x3f)) - 1;
  }
  else {
    state->stopMask = (1L << (bVar2 & 0x3f)) + -1 << ((char)local_24 - bVar2 & 0x3f);
  }
  return;
}

Assistant:

static void ZSTD_ldm_gear_init(ldmRollingHashState_t* state, ldmParams_t const* params)
{
    unsigned maxBitsInMask = MIN(params->minMatchLength, 64);
    unsigned hashRateLog = params->hashRateLog;

    state->rolling = ~(U32)0;

    /* The choice of the splitting criterion is subject to two conditions:
     *   1. it has to trigger on average every 2^(hashRateLog) bytes;
     *   2. ideally, it has to depend on a window of minMatchLength bytes.
     *
     * In the gear hash algorithm, bit n depends on the last n bytes;
     * so in order to obtain a good quality splitting criterion it is
     * preferable to use bits with high weight.
     *
     * To match condition 1 we use a mask with hashRateLog bits set
     * and, because of the previous remark, we make sure these bits
     * have the highest possible weight while still respecting
     * condition 2.
     */
    if (hashRateLog > 0 && hashRateLog <= maxBitsInMask) {
        state->stopMask = (((U64)1 << hashRateLog) - 1) << (maxBitsInMask - hashRateLog);
    } else {
        /* In this degenerate case we simply honor the hash rate. */
        state->stopMask = ((U64)1 << hashRateLog) - 1;
    }
}